

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

int stbi__mad4sizes_valid(int a,int b,int c,int d,int add)

{
  int iVar1;
  undefined1 local_1d;
  int add_local;
  int d_local;
  int c_local;
  int b_local;
  int a_local;
  
  iVar1 = stbi__mul2sizes_valid(a,b);
  local_1d = false;
  if (iVar1 != 0) {
    iVar1 = stbi__mul2sizes_valid(a * b,c);
    local_1d = false;
    if (iVar1 != 0) {
      iVar1 = stbi__mul2sizes_valid(a * b * c,d);
      local_1d = false;
      if (iVar1 != 0) {
        iVar1 = stbi__addsizes_valid(a * b * c * d,add);
        local_1d = iVar1 != 0;
      }
    }
  }
  return (int)local_1d;
}

Assistant:

static int stbi__mad4sizes_valid(int a, int b, int c, int d, int add)
{
   return stbi__mul2sizes_valid(a, b) && stbi__mul2sizes_valid(a*b, c) &&
      stbi__mul2sizes_valid(a*b*c, d) && stbi__addsizes_valid(a*b*c*d, add);
}